

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O2

vector<duckdb::OpenFileInfo,_true> * __thiscall
duckdb::LocalFileSystem::FetchFileWithoutGlob
          (vector<duckdb::OpenFileInfo,_true> *__return_storage_ptr__,LocalFileSystem *this,
          string *path,FileOpener *opener,bool absolute_path)

{
  int iVar1;
  pointer a;
  string search_paths_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  search_paths;
  LogicalType local_a8;
  string joined_path;
  Value value;
  
  (__return_storage_ptr__->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
  ).super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
  ).super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
  ).super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*(this->super_FileSystem)._vptr_FileSystem[0x12])(this,path,opener);
  if (((char)iVar1 == '\0') &&
     (iVar1 = (*(this->super_FileSystem)._vptr_FileSystem[0x13])(this,path,opener),
     (char)iVar1 == '\0')) {
    if (absolute_path) {
      return __return_storage_ptr__;
    }
    LogicalType::LogicalType(&local_a8,SQLNULL);
    Value::Value(&value,&local_a8);
    LogicalType::~LogicalType(&local_a8);
    if (opener != (FileOpener *)0x0) {
      ::std::__cxx11::string::string
                ((string *)&search_paths_str,"file_search_path",(allocator *)&joined_path);
      iVar1 = (*opener->_vptr_FileOpener[3])(opener,&search_paths_str,&value);
      ::std::__cxx11::string::~string((string *)&search_paths_str);
      if ((char)iVar1 != '\x03') {
        Value::ToString_abi_cxx11_((string *)&search_paths_str,&value);
        StringUtil::Split(&search_paths,&search_paths_str,',');
        for (a = search_paths.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            a != search_paths.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; a = (pointer)((string *)a + 1)) {
          FileSystem::JoinPath(&joined_path,&this->super_FileSystem,(string *)a,path);
          iVar1 = (*(this->super_FileSystem)._vptr_FileSystem[0x12])(this,&joined_path,opener);
          if (((char)iVar1 != '\0') ||
             (iVar1 = (*(this->super_FileSystem)._vptr_FileSystem[0x13])(this,&joined_path,opener),
             (char)iVar1 != '\0')) {
            ::std::vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>> *)
                       __return_storage_ptr__,&joined_path);
          }
          ::std::__cxx11::string::~string((string *)&joined_path);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&search_paths);
        ::std::__cxx11::string::~string((string *)&search_paths_str);
      }
    }
    Value::~Value(&value);
    return __return_storage_ptr__;
  }
  ::std::vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>>::
  emplace_back<std::__cxx11::string_const&>
            ((vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>> *)
             __return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)path);
  return __return_storage_ptr__;
}

Assistant:

vector<OpenFileInfo> LocalFileSystem::FetchFileWithoutGlob(const string &path, FileOpener *opener, bool absolute_path) {
	vector<OpenFileInfo> result;
	if (FileExists(path, opener) || IsPipe(path, opener)) {
		result.emplace_back(path);
	} else if (!absolute_path) {
		Value value;
		if (opener && opener->TryGetCurrentSetting("file_search_path", value)) {
			auto search_paths_str = value.ToString();
			vector<std::string> search_paths = StringUtil::Split(search_paths_str, ',');
			for (const auto &search_path : search_paths) {
				auto joined_path = JoinPath(search_path, path);
				if (FileExists(joined_path, opener) || IsPipe(joined_path, opener)) {
					result.emplace_back(joined_path);
				}
			}
		}
	}
	return result;
}